

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(ConvolutionLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConvolutionLayerParams_00700118;
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  (this->dilationfactor_).current_size_ = 0;
  (this->dilationfactor_).total_size_ = 0;
  (this->dilationfactor_).rep_ = (Rep *)0x0;
  (this->outputshape_).current_size_ = 0;
  (this->outputshape_).total_size_ = 0;
  (this->outputshape_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->kernelsize_).current_size_ = 0;
  (this->kernelsize_).total_size_ = 0;
  (this->kernelsize_).rep_ = (Rep *)0x0;
  if (this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  *(undefined8 *)((long)&this->kernelchannels_ + 2) = 0;
  *(undefined8 *)((long)&this->ngroups_ + 2) = 0;
  this->outputchannels_ = 0;
  this->kernelchannels_ = 0;
  this->weights_ = (WeightParams *)0x0;
  this->bias_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

ConvolutionLayerParams::ConvolutionLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ConvolutionLayerParams)
}